

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
nlohmann::json_abi_v3_12_0::detail::
serializer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::dump_float(serializer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
             *this,number_float_t x)

{
  array<char,_64UL> *first;
  element_type *peVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  if (0x7fefffffffffffff < (ulong)ABS(x)) {
    peVar1 = (this->o).
             super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*peVar1->_vptr_output_adapter_protocol[1])(peVar1,"null",4);
    return;
  }
  first = &this->number_buffer;
  pcVar2 = to_chars<double>(first->_M_elems,(char *)&this->loc,x);
  peVar1 = (this->o).
           super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  UNRECOVERED_JUMPTABLE = peVar1->_vptr_output_adapter_protocol[1];
  (*UNRECOVERED_JUMPTABLE)(peVar1,first,(long)pcVar2 - (long)first,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void dump_float(number_float_t x)
    {
        // NaN / inf
        if (!std::isfinite(x))
        {
            o->write_characters("null", 4);
            return;
        }

        // If number_float_t is an IEEE-754 single or double precision number,
        // use the Grisu2 algorithm to produce short numbers which are
        // guaranteed to round-trip, using strtof and strtod, resp.
        //
        // NB: The test below works if <long double> == <double>.
        static constexpr bool is_ieee_single_or_double
            = (std::numeric_limits<number_float_t>::is_iec559 && std::numeric_limits<number_float_t>::digits == 24 && std::numeric_limits<number_float_t>::max_exponent == 128) ||
              (std::numeric_limits<number_float_t>::is_iec559 && std::numeric_limits<number_float_t>::digits == 53 && std::numeric_limits<number_float_t>::max_exponent == 1024);

        dump_float(x, std::integral_constant<bool, is_ieee_single_or_double>());
    }